

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

span<const_slang::ast::Expression_*const,_18446744073709551615UL> __thiscall
slang::ast::bindExpressionList
          (ast *this,Type *patternType,Type *elementType,size_t replCount,bitwidth_t expectedCount,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *items,ASTContext *context,
          SourceRange sourceRange,bool *bad)

{
  uint uVar1;
  size_t sVar2;
  SourceRange sourceRange_00;
  bool bVar3;
  ExpressionSyntax *syntax;
  Expression *this_00;
  Diagnostic *pDVar4;
  undefined4 extraout_var;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  EVP_PKEY_CTX *dst;
  undefined4 in_register_00000084;
  ParentList *pPVar5;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar6;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  iterator_base<const_slang::syntax::ExpressionSyntax_*> local_98;
  Type *local_88;
  Type *local_80;
  Expression *local_78;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  
  pPVar5 = (ParentList *)CONCAT44(in_register_00000084,expectedCount);
  uVar1 = *(uint *)&(items->super_SyntaxListBase).super_SyntaxNode.parent;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_98.index = 0;
  local_70[0].cap = 5;
  sVar2 = (pPVar5->elements)._M_extent._M_extent_value;
  local_98.list = pPVar5;
  local_88 = (Type *)this;
  local_80 = elementType;
  for (; (local_98.list != pPVar5 || (local_98.index != sVar2 + 1 >> 1));
      local_98.index = local_98.index + 1) {
    syntax = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<const_slang::syntax::ExpressionSyntax_*>::dereference(&local_98);
    this_00 = Expression::bindArgument
                        (patternType,uVar1 >> 0x14 & Out,(bitmask<slang::ast::VariableFlags>)0x0,
                         syntax,(ASTContext *)items);
    local_78 = this_00;
    SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
              ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_78);
    bVar3 = Expression::bad(this_00);
    *(byte *)sourceRange.endLoc = *(byte *)sourceRange.endLoc | bVar3;
    elementType = extraout_RDX;
  }
  if (((uint)replCount != 0) &&
     ((*(char *)sourceRange.endLoc == '\0' &&
      ((long)local_80 * local_70[0].len - (replCount & 0xffffffff) != 0)))) {
    sourceRange_00.endLoc = sourceRange.startLoc;
    sourceRange_00.startLoc = (SourceLocation)context;
    pDVar4 = ASTContext::addDiag((ASTContext *)items,(DiagCode)0xae0007,sourceRange_00);
    pDVar4 = operator<<(pDVar4,local_88);
    pDVar4 = Diagnostic::operator<<<unsigned_int>(pDVar4,(uint)replCount);
    Diagnostic::operator<<<unsigned_long>(pDVar4,local_70[0].len);
    *(undefined1 *)sourceRange.endLoc = 1;
    elementType = extraout_RDX_00;
  }
  dst = (EVP_PKEY_CTX *)*(items->super_SyntaxListBase)._vptr_SyntaxListBase;
  sVar6._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::Expression_*>::copy
                 (local_70,dst,(EVP_PKEY_CTX *)elementType);
  sVar6._M_ptr._4_4_ = extraout_var;
  SmallVectorBase<const_slang::ast::Expression_*>::cleanup(local_70,dst);
  sVar6._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
  return sVar6;
}

Assistant:

static std::span<const Expression* const> bindExpressionList(
    const Type& patternType, const Type& elementType, size_t replCount, bitwidth_t expectedCount,
    const SeparatedSyntaxList<ExpressionSyntax>& items, const ASTContext& context,
    SourceRange sourceRange, bool& bad) {

    const bool isLValue = context.flags.has(ASTFlags::LValue);
    auto direction = isLValue ? ArgumentDirection::Out : ArgumentDirection::In;

    SmallVector<const Expression*> elems;
    for (auto item : items) {
        auto& expr = Expression::bindArgument(elementType, direction, {}, *item, context);
        elems.push_back(&expr);
        bad |= expr.bad();
    }

    if (!bad && expectedCount && expectedCount != elems.size() * replCount) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << patternType << expectedCount << elems.size();
        bad = true;
    }

    return elems.copy(context.getCompilation());
}